

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O2

QDomNode __thiscall QDomNode::appendChild(QDomNode *this,QDomNode *newChild)

{
  QDomNodePrivate *pQVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined8 *in_RDX;
  long in_FS_OFFSET;
  char local_30 [24];
  char *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = newChild->impl;
  if (pQVar1 == (QDomNodePrivate *)0x0) {
    local_30[0] = '\x02';
    local_30[1] = '\0';
    local_30[2] = '\0';
    local_30[3] = '\0';
    local_30[0x14] = '\0';
    local_30[0x15] = '\0';
    local_30[0x16] = '\0';
    local_30[0x17] = '\0';
    local_30[4] = '\0';
    local_30[5] = '\0';
    local_30[6] = '\0';
    local_30[7] = '\0';
    local_30[8] = '\0';
    local_30[9] = '\0';
    local_30[10] = '\0';
    local_30[0xb] = '\0';
    local_30[0xc] = '\0';
    local_30[0xd] = '\0';
    local_30[0xe] = '\0';
    local_30[0xf] = '\0';
    local_30[0x10] = '\0';
    local_30[0x11] = '\0';
    local_30[0x12] = '\0';
    local_30[0x13] = '\0';
    local_18 = "default";
    QMessageLogger::warning(local_30,"Calling appendChild() on a null node does nothing.");
    QDomNode(this);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_10) goto LAB_0010d0d6;
  }
  else {
    iVar2 = (*pQVar1->_vptr_QDomNodePrivate[7])(pQVar1,*in_RDX);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
LAB_0010d0d6:
      __stack_chk_fail();
    }
    QDomNode(this,(QDomNodePrivate *)CONCAT44(extraout_var,iVar2));
  }
  return (QDomNode)(QDomNodePrivate *)this;
}

Assistant:

QDomNode QDomNode::appendChild(const QDomNode& newChild)
{
    if (!impl) {
        qWarning("Calling appendChild() on a null node does nothing.");
        return QDomNode();
    }
    return QDomNode(IMPL->appendChild(newChild.impl));
}